

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

string * cmTargetPropertyComputer::ComputeLocationForBuild<cmTarget>(cmTarget *tgt)

{
  cmTarget *this;
  bool bVar1;
  int iVar2;
  cmGlobalGenerator *this_00;
  string *psVar3;
  cmGeneratorTarget *this_01;
  cmGeneratorTarget *gt;
  cmGlobalGenerator *gg;
  allocator<char> local_59;
  string local_58;
  string local_38;
  cmTarget *local_18;
  cmTarget *tgt_local;
  
  local_18 = tgt;
  if (ComputeLocationForBuild<cmTarget>(cmTarget_const*)::loc_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&ComputeLocationForBuild<cmTarget>(cmTarget_const*)::loc_abi_cxx11_)
    ;
    if (iVar2 != 0) {
      std::__cxx11::string::string
                ((string *)&ComputeLocationForBuild<cmTarget>(cmTarget_const*)::loc_abi_cxx11_);
      __cxa_atexit(std::__cxx11::string::~string,
                   &ComputeLocationForBuild<cmTarget>(cmTarget_const*)::loc_abi_cxx11_,&__dso_handle
                  );
      __cxa_guard_release(&ComputeLocationForBuild<cmTarget>(cmTarget_const*)::loc_abi_cxx11_);
    }
  }
  bVar1 = cmTarget::IsImported(local_18);
  this = local_18;
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"",&local_59);
    cmTarget::ImportedGetFullPath(&local_38,this,&local_58,RuntimeBinaryArtifact);
    std::__cxx11::string::operator=
              ((string *)&ComputeLocationForBuild<cmTarget>(cmTarget_const*)::loc_abi_cxx11_,
               (string *)&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
    std::allocator<char>::~allocator(&local_59);
  }
  else {
    this_00 = cmTarget::GetGlobalGenerator(local_18);
    bVar1 = cmGlobalGenerator::GetConfigureDoneCMP0026(this_00);
    if (!bVar1) {
      cmGlobalGenerator::CreateGenerationObjects(this_00,AllTargets);
    }
    psVar3 = cmTarget::GetName_abi_cxx11_(local_18);
    this_01 = cmGlobalGenerator::FindGeneratorTarget(this_00,psVar3);
    psVar3 = cmGeneratorTarget::GetLocationForBuild_abi_cxx11_(this_01);
    std::__cxx11::string::operator=
              ((string *)&ComputeLocationForBuild<cmTarget>(cmTarget_const*)::loc_abi_cxx11_,
               (string *)psVar3);
  }
  return &ComputeLocationForBuild<cmTarget>(cmTarget_const*)::loc_abi_cxx11_;
}

Assistant:

const std::string& cmTargetPropertyComputer::ComputeLocationForBuild<cmTarget>(
  cmTarget const* tgt)
{
  static std::string loc;
  if (tgt->IsImported()) {
    loc = tgt->ImportedGetFullPath("", cmStateEnums::RuntimeBinaryArtifact);
    return loc;
  }

  cmGlobalGenerator* gg = tgt->GetGlobalGenerator();
  if (!gg->GetConfigureDoneCMP0026()) {
    gg->CreateGenerationObjects();
  }
  cmGeneratorTarget* gt = gg->FindGeneratorTarget(tgt->GetName());
  loc = gt->GetLocationForBuild();
  return loc;
}